

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

HighsStatus
readSolutionFileReturn
          (HighsStatus status,HighsSolution *solution,HighsBasis *basis,HighsSolution *read_solution
          ,HighsBasis *read_basis,ifstream *in_file)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  HighsInt HVar4;
  
  std::ifstream::close();
  if (status == kOk) {
    bVar1 = read_solution->dual_valid;
    solution->value_valid = read_solution->value_valid;
    solution->dual_valid = bVar1;
    std::vector<double,_std::allocator<double>_>::operator=
              (&solution->col_value,&read_solution->col_value);
    std::vector<double,_std::allocator<double>_>::operator=
              (&solution->col_dual,&read_solution->col_dual);
    std::vector<double,_std::allocator<double>_>::operator=
              (&solution->row_value,&read_solution->row_value);
    std::vector<double,_std::allocator<double>_>::operator=
              (&solution->row_dual,&read_solution->row_dual);
    bVar1 = read_basis->alien;
    bVar2 = read_basis->useful;
    bVar3 = read_basis->was_alien;
    HVar4 = read_basis->debug_id;
    basis->valid = read_basis->valid;
    basis->alien = bVar1;
    basis->useful = bVar2;
    basis->was_alien = bVar3;
    basis->debug_id = HVar4;
    basis->debug_update_count = read_basis->debug_update_count;
    std::__cxx11::string::_M_assign((string *)&basis->debug_origin_name);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
              (&basis->col_status,&read_basis->col_status);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
              (&basis->row_status,&read_basis->row_status);
  }
  return status;
}

Assistant:

HighsStatus readSolutionFileReturn(const HighsStatus status,
                                   HighsSolution& solution, HighsBasis& basis,
                                   const HighsSolution& read_solution,
                                   const HighsBasis& read_basis,
                                   std::ifstream& in_file) {
  in_file.close();
  if (status != HighsStatus::kOk) {
    return status;
  }
  solution = read_solution;
  basis = read_basis;
  return HighsStatus::kOk;
}